

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timer.cpp
# Opt level: O2

void test_run_at_func(time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      t1,int ms)

{
  longlong lVar1;
  long lVar2;
  Logger *pLVar3;
  id local_28;
  
  local_28._M_thread = pthread_self();
  lVar1 = tid_to_ll(&local_28);
  lVar2 = std::chrono::_V2::steady_clock::now();
  pLVar3 = Logger::get_instance();
  if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","test_run_at_func",0x1a);
  }
  if (1 < (int)g_log_level) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/timer/tests/test_timer.cpp"
                      ,"test_run_at_func",0x1a,LOG_LEVEL_INFO,
                      "[tid:%lld] hello, run_at_func ! run at %d ms, time diff is %d ms\n",lVar1,ms,
                      (ulong)(uint)(int)((double)(lVar2 - (long)t1.__d.__r) / 1000000.0));
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  return;
}

Assistant:

void test_run_at_func(chrono::time_point<chrono::steady_clock> t1, int ms)
{
    long long tid = tid_to_ll(this_thread::get_id());

    auto t2 = chrono::steady_clock::now();
    int tm_diff = static_cast<int>( chrono::duration<double, milli>(t2-t1).count() );
    LOG_INFO("[tid:%lld] hello, run_at_func ! run at %d ms, time diff is %d ms\n", tid, ms, tm_diff);   
}